

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

int __thiscall
QtPrivate::QGenericArrayOps<QCss::Declaration>::truncate
          (QGenericArrayOps<QCss::Declaration> *this,char *__file,__off_t __length)

{
  Declaration *pDVar1;
  int extraout_EAX;
  
  pDVar1 = (this->super_QArrayDataPointer<QCss::Declaration>).ptr;
  std::_Destroy_aux<false>::__destroy<QCss::Declaration*>
            (pDVar1 + (long)__file,pDVar1 + (this->super_QArrayDataPointer<QCss::Declaration>).size)
  ;
  (this->super_QArrayDataPointer<QCss::Declaration>).size = (qsizetype)__file;
  return extraout_EAX;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }